

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O2

SessionID * __thiscall FIX::SessionID::operator=(SessionID *this,SessionID *param_1)

{
  FieldBase::operator=((FieldBase *)this,(FieldBase *)param_1);
  FieldBase::operator=((FieldBase *)&this->m_senderCompID,(FieldBase *)&param_1->m_senderCompID);
  FieldBase::operator=((FieldBase *)&this->m_targetCompID,(FieldBase *)&param_1->m_targetCompID);
  std::__cxx11::string::operator=
            ((string *)&this->m_sessionQualifier,(string *)&param_1->m_sessionQualifier);
  this->m_isFIXT = param_1->m_isFIXT;
  std::__cxx11::string::operator=
            ((string *)&this->m_frozenString,(string *)&param_1->m_frozenString);
  return this;
}

Assistant:

SessionID() { toString(m_frozenString); }